

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O1

void Aig_NodeFixBufferFanins(Aig_Man_t *p,Aig_Obj_t *pObj,int fUpdateLevel)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  Aig_Type_t Type;
  uint uVar4;
  
  p->nBufFixes = p->nBufFixes + 1;
  uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar3 & 7) != 3) {
    if ((uVar3 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x195,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    if (((*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x18) & 7) != 4) &&
       ((*(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x18) & 7) != 4)) {
      __assert_fail("Aig_ObjIsBuf(Aig_ObjFanin0(pObj)) || Aig_ObjIsBuf(Aig_ObjFanin1(pObj))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x196,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pAVar2 = Aig_ObjReal_rec(pObj->pFanin0);
    pAVar1 = Aig_ObjReal_rec(pObj->pFanin1);
    Type = *(Aig_Type_t *)&pObj->field_0x18 & AIG_OBJ_VOID;
    if (0xfffffffd < Type - AIG_OBJ_VOID) {
      pAVar2 = Aig_Oper(p,pAVar2,pAVar1,Type);
      Aig_ObjReplace(p,pObj,pAVar2,fUpdateLevel);
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1a0,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x18) & 7) != 4) {
    __assert_fail("Aig_ObjIsBuf(Aig_ObjFanin0(pObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,399,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  pAVar1 = Aig_ObjReal_rec(pObj->pFanin0);
  pAVar2 = pObj->pFanin0;
  uVar3 = 1;
  uVar4 = 1;
  if (pAVar2 != (Aig_Obj_t *)0x0) {
    uVar4 = ((uint)pAVar2 ^ *(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
  }
  if (pAVar1 != (Aig_Obj_t *)0x0) {
    uVar3 = ((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
  }
  if (uVar4 == uVar3) {
    Aig_ObjPatchFanin0(p,pObj,pAVar1);
    return;
  }
  __assert_fail("Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) == Aig_ObjPhaseReal(pFanReal0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                ,0x191,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

void Aig_NodeFixBufferFanins( Aig_Man_t * p, Aig_Obj_t * pObj, int fUpdateLevel )
{
    Aig_Obj_t * pFanReal0, * pFanReal1, * pResult = NULL;
    p->nBufFixes++;
    if ( Aig_ObjIsCo(pObj) )
    {
        assert( Aig_ObjIsBuf(Aig_ObjFanin0(pObj)) );
        pFanReal0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
        assert( Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) == Aig_ObjPhaseReal(pFanReal0) );
        Aig_ObjPatchFanin0( p, pObj, pFanReal0 );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    assert( Aig_ObjIsBuf(Aig_ObjFanin0(pObj)) || Aig_ObjIsBuf(Aig_ObjFanin1(pObj)) );
    // get the real fanins
    pFanReal0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
    pFanReal1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
    // get the new node
    if ( Aig_ObjIsNode(pObj) )
        pResult = Aig_Oper( p, pFanReal0, pFanReal1, Aig_ObjType(pObj) );
//    else if ( Aig_ObjIsLatch(pObj) )
//        pResult = Aig_Latch( p, pFanReal0, Aig_ObjInit(pObj) );
    else 
        assert( 0 );
    // replace the node with buffer by the node without buffer
    Aig_ObjReplace( p, pObj, pResult, fUpdateLevel );
}